

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggx.cpp
# Opt level: O0

float __thiscall ggx::calculate_shadow_masking_term(ggx *this,vec3 *light_dir,vec3 *view_dir)

{
  float fVar1;
  float fVar2;
  float g2;
  float lambda_l;
  float lambda_v;
  vec3 *view_dir_local;
  vec3 *light_dir_local;
  ggx *this_local;
  
  if (0.0 < (light_dir->field_0).field_0.z) {
    fVar1 = lambda(this,(view_dir->field_0).field_0.z);
    fVar2 = lambda(this,(light_dir->field_0).field_0.z);
    this_local._4_4_ = 1.0 / (fVar1 + 1.0 + fVar2);
  }
  else {
    this_local._4_4_ = 0.0;
  }
  return this_local._4_4_;
}

Assistant:

float ggx::calculate_shadow_masking_term(const glm::vec3 &light_dir, const glm::vec3 &view_dir) const
{
  // See for more details:
  // - Understanding the Masking-Shadowing Function in Microfacet-Based BRDFs
  // - Microfacet Models for Refraction through Rough Surfaces
  // - PBR Diffuse Lighting for GGX+Smith Microsurfaces (Slides)

  if (light_dir.z <= 0.0f)
  {
    return 0.0f;
  }

  const auto lambda_v = lambda(view_dir.z);
  const auto lambda_l = lambda(light_dir.z);

  auto g2 = 1.0f / (1.0f + lambda_v + lambda_l);

  return g2;
}